

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

int __thiscall MuxerManager::getDefaultSubTrackIdx(MuxerManager *this,SubTrackMode *mode)

{
  pointer pSVar1;
  bool bVar2;
  const_iterator cVar3;
  ostream *poVar4;
  int iVar5;
  pointer pSVar6;
  allocator<char> local_79;
  SubTrackMode *local_78;
  string paramVal;
  key_type local_50;
  
  paramVal._M_dataplus._M_p = (pointer)&paramVal.field_2;
  paramVal._M_string_length = 0;
  paramVal.field_2._M_local_buf[0] = '\0';
  pSVar6 = (this->m_metaDemuxer).m_codecInfo.
           super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->m_metaDemuxer).m_codecInfo.
           super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = 0;
  local_78 = mode;
  do {
    if (pSVar6 == pSVar1) {
LAB_001ca619:
      iVar5 = -1;
LAB_001ca61c:
      std::__cxx11::string::~string((string *)&paramVal);
      return iVar5;
    }
    if (*(pSVar6->m_codec)._M_dataplus._M_p == 'S') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"default",&local_79);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(pSVar6->m_addParams)._M_t,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (&(pSVar6->m_addParams)._M_t._M_impl.super__Rb_tree_header !=
          (_Rb_tree_header *)cVar3._M_node) {
        std::__cxx11::string::_M_assign((string *)&paramVal);
        if (iVar5 != -1) {
          bVar2 = std::operator==(&paramVal,"all");
          if (bVar2) {
            *local_78 = All;
            goto LAB_001ca61c;
          }
          bVar2 = std::operator==(&paramVal,"forced");
          if (bVar2) {
            *local_78 = Forced;
            goto LAB_001ca61c;
          }
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Invalid \'default\' parameter value for subtitle track ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
          poVar4 = std::operator<<(poVar4,", ignoring");
          std::endl<char,std::char_traits<char>>(poVar4);
          sLastMsg = true;
        }
        goto LAB_001ca619;
      }
      iVar5 = iVar5 + 1;
    }
    pSVar6 = pSVar6 + 1;
  } while( true );
}

Assistant:

int MuxerManager::getDefaultSubTrackIdx(SubTrackMode& mode) const
{
    std::string paramVal;
    const auto idx = seekDefaultTrack(m_metaDemuxer.getStreamInfo(), paramVal,
                                      [](auto&& streamInfo) { return streamInfo.m_codec[0] == 'S'; });
    if (idx != -1)
    {
        if (paramVal == "all")
        {
            mode = SubTrackMode::All;
        }
        else if (paramVal == "forced")
        {
            mode = SubTrackMode::Forced;
        }
        else
        {
            LTRACE(LT_WARN, 2, "Invalid 'default' parameter value for subtitle track " << idx << ", ignoring");
            return -1;
        }
    }
    return idx;
}